

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_argument(lysp_yin_ctx *ctx,void *parent,yin_argument_meta *arg_meta,
                         lysp_ext_instance **exts)

{
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [2];
  lysp_ext_instance **exts_local;
  yin_argument_meta *arg_meta_local;
  void *parent_local;
  lysp_yin_ctx *ctx_local;
  
  ret___1 = 0x350000;
  subelems[0]._0_8_ = arg_meta->flags;
  subelems[0].dest._0_2_ = 2;
  memset(&subelems[0].flags,0,0x18);
  subelems[0].flags = 0;
  subelems[0]._18_2_ = 0xf;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if (((ctx_local._4_4_ == LY_SUCCESS) &&
      (ctx_local._4_4_ =
            yin_parse_attribute(ctx,YIN_ARG_NAME,arg_meta->argument,Y_IDENTIF_ARG,LY_STMT_ARGUMENT),
      ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ =
           yin_parse_content(ctx,(yin_subelement *)&ret___1,2,parent,LY_STMT_ARGUMENT,(char **)0x0,
                             exts), ctx_local._4_4_ == LY_SUCCESS)) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_argument(struct lysp_yin_ctx *ctx, const void *parent, struct yin_argument_meta *arg_meta, struct lysp_ext_instance **exts)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_YIN_ELEMENT, arg_meta->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, arg_meta->argument, Y_IDENTIF_ARG, LY_STMT_ARGUMENT));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ARGUMENT, NULL, exts));

    return LY_SUCCESS;
}